

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_descriptor.cpp
# Opt level: O0

streampos __thiscall
boost::iostreams::detail::file_descriptor_impl::seek
          (file_descriptor_impl *this,stream_offset off,seekdir way)

{
  streampos sVar1;
  int local_c0;
  detail local_98 [32];
  __off64_t local_78;
  stream_offset result;
  error_code local_60;
  failure local_50 [36];
  seekdir local_2c;
  stream_offset sStack_28;
  seekdir way_local;
  stream_offset off_local;
  file_descriptor_impl *this_local;
  
  local_2c = way;
  sStack_28 = off;
  off_local = (stream_offset)this;
  if (off < -0x8000000000000000) {
    std::error_code::error_code<std::io_errc,void>(&local_60,stream);
    std::ios_base::failure[abi:cxx11]::failure((char *)local_50,(error_code *)"bad offset");
    throw_exception<std::ios_base::failure[abi:cxx11]>(local_50);
  }
  if (way == _S_beg) {
    local_c0 = 0;
  }
  else {
    local_c0 = 2;
    if (way == _S_cur) {
      local_c0 = 1;
    }
  }
  local_78 = lseek64(this->handle_,off,local_c0);
  if (local_78 == -1) {
    system_failure_abi_cxx11_(local_98,"failed seeking");
    throw_exception<std::ios_base::failure[abi:cxx11]>((failure *)local_98);
  }
  sVar1 = offset_to_position(local_78);
  return sVar1;
}

Assistant:

std::streampos file_descriptor_impl::seek
    (stream_offset off, BOOST_IOS::seekdir way)
{
#ifdef BOOST_IOSTREAMS_WINDOWS
    LONG lDistanceToMove = static_cast<LONG>(off & 0xffffffff);
    LONG lDistanceToMoveHigh = static_cast<LONG>(off >> 32);
    DWORD dwResultLow =
        ::SetFilePointer( handle_,
                          lDistanceToMove,
                          &lDistanceToMoveHigh,
                          way == BOOST_IOS::beg ?
                              FILE_BEGIN :
                              way == BOOST_IOS::cur ?
                                FILE_CURRENT :
                                FILE_END );
    if ( dwResultLow == INVALID_SET_FILE_POINTER &&
         ::GetLastError() != NO_ERROR )
    {
        boost::throw_exception(system_failure("failed seeking"));
    } else {
       return offset_to_position(
                  (stream_offset(lDistanceToMoveHigh) << 32) + dwResultLow
              );
    }
#else // #ifdef BOOST_IOSTREAMS_WINDOWS
    if ( off > integer_traits<BOOST_IOSTREAMS_FD_OFFSET>::const_max ||
         off < integer_traits<BOOST_IOSTREAMS_FD_OFFSET>::const_min )
    {
        boost::throw_exception(BOOST_IOSTREAMS_FAILURE("bad offset"));
    }
    stream_offset result =
        BOOST_IOSTREAMS_FD_SEEK(
            handle_,
            static_cast<BOOST_IOSTREAMS_FD_OFFSET>(off),
            ( way == BOOST_IOS::beg ?
                  SEEK_SET :
                  way == BOOST_IOS::cur ?
                      SEEK_CUR :
                      SEEK_END ) 
        );
    if (result == -1)
        boost::throw_exception(system_failure("failed seeking"));
    return offset_to_position(result);
#endif // #ifdef BOOST_IOSTREAMS_WINDOWS
}